

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue::~IfcPropertyBoundedValue
          (IfcPropertyBoundedValue *this)

{
  undefined8 *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  puVar1 = (undefined8 *)(&this->field_0x0 + lVar2);
  *(undefined ***)(&this->field_0x0 + lVar2) = &PTR__IfcPropertyBoundedValue_009237d8;
  *(undefined ***)(&this->field_0xc0 + lVar2) = &PTR__IfcPropertyBoundedValue_00923850;
  *(undefined ***)(&this->field_0x58 + lVar2) = &PTR__IfcPropertyBoundedValue_00923800;
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>).
           _vptr_ObjectHelper + lVar2) = &PTR__IfcPropertyBoundedValue_00923828;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->Unit).ptr.
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x13] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x13]);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x10] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x10]);
  }
  *puVar1 = 0x923968;
  puVar1[0x18] = 0x923990;
  if ((long *)puVar1[6] != puVar1 + 8) {
    operator_delete((long *)puVar1[6],puVar1[8] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
    return;
  }
  return;
}

Assistant:

IfcPropertyBoundedValue() : Object("IfcPropertyBoundedValue") {}